

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::fixup_anonymous_struct_names(CompilerGLSL *this)

{
  ParsedIR *this_00;
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRType *type;
  long lVar4;
  LoopLock local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  visited;
  
  visited._M_h._M_buckets = &visited._M_h._M_single_bucket;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->super_Compiler).ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  lVar4 = 0;
  do {
    if (sVar2 << 2 == lVar4) {
      ParsedIR::LoopLock::~LoopLock(&local_70);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&visited._M_h);
      return;
    }
    id = *(uint *)((long)&pTVar1->id + lVar4);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
        TypeType) {
      type = ParsedIR::get<spirv_cross::SPIRType>(this_00,id);
      if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
        bVar3 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock)
        ;
        if (!bVar3) {
          bVar3 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                             DecorationBufferBlock);
          if (!bVar3) goto LAB_0024c65a;
        }
        fixup_anonymous_struct_names(this,&visited,type);
      }
    }
LAB_0024c65a:
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void CompilerGLSL::fixup_anonymous_struct_names()
{
	// HLSL codegen can often end up emitting anonymous structs inside blocks, which
	// breaks GL linking since all names must match ...
	// Try to emit sensible code, so attempt to find such structs and emit anon_$member.

	// Breaks exponential explosion with weird type trees.
	std::unordered_set<uint32_t> visited;

	ir.for_each_typed_id<SPIRType>([&](uint32_t, SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    (has_decoration(type.self, DecorationBlock) ||
		     has_decoration(type.self, DecorationBufferBlock)))
		{
			fixup_anonymous_struct_names(visited, type);
		}
	});
}